

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * RemapInstructionArgument
                    (ExpressionContext *ctx,VmModule *module,VmValue *argOrig,
                    SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>
                    *variableRemap,
                    SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>
                    *instructionRemap)

{
  bool bVar1;
  ExpressionContext *this;
  VmInstruction **ppVVar2;
  VmFunction *argOrigFunction;
  VmInstruction **remap_1;
  VmInstruction *argOrigInst;
  VmConstant *ptr;
  VmConstant *local_60;
  ExpressionContext *local_58;
  VmConstant *reference;
  VmConstant **remap;
  VariableData *containerOrig;
  VmConstant *argOrigConstant;
  SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> *instructionRemap_local;
  SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> *variableRemap_local;
  VmValue *argOrig_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  argOrigConstant = (VmConstant *)instructionRemap;
  instructionRemap_local =
       (SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U> *)variableRemap;
  variableRemap_local =
       (SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U> *)argOrig;
  argOrig_local = (VmValue *)module;
  module_local = (VmModule *)ctx;
  containerOrig = (VariableData *)getType<VmConstant>(argOrig);
  if (containerOrig == (VariableData *)0x0) {
    remap_1 = (VmInstruction **)getType<VmInstruction>((VmValue *)variableRemap_local);
    if ((VmInstruction *)remap_1 == (VmInstruction *)0x0) {
      ctx_local = (ExpressionContext *)getType<VmFunction>((VmValue *)variableRemap_local);
      if (ctx_local == (ExpressionContext *)0x0) {
        __assert_fail("!\"unexpected type\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x19b2,
                      "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                     );
      }
    }
    else {
      ppVVar2 = SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>::find
                          ((SmallDenseMap<VmInstruction_*,_VmInstruction_*,_VmInstructionHasher,_16U>
                            *)argOrigConstant,(VmInstruction **)&remap_1);
      if (ppVVar2 == (VmInstruction **)0x0) {
        __assert_fail("remap",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.cpp"
                      ,0x19a9,
                      "VmValue *RemapInstructionArgument(ExpressionContext &, VmModule *, VmValue *, const SmallDenseMap<VariableData *, VmConstant *, VariableDataHasher, 16> &, const SmallDenseMap<VmInstruction *, VmInstruction *, VmInstructionHasher, 16> &)"
                     );
      }
      ctx_local = (ExpressionContext *)*ppVVar2;
    }
  }
  else {
    remap = (VmConstant **)(containerOrig->offsetUsers).storage[1].value;
    if (((VariableData *)remap == (VariableData *)0x0) ||
       (reference = (VmConstant *)
                    SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>::find
                              ((SmallDenseMap<VariableData_*,_VmConstant_*,_VariableDataHasher,_16U>
                                *)instructionRemap_local,(VariableData **)&remap),
       reference == (VmConstant *)0x0)) {
      ctx_local = (ExpressionContext *)containerOrig;
    }
    else if (((containerOrig->offsetUsers).storage[2].key & 0x100) == 0) {
      argOrigInst = (VmInstruction *)
                    CreateConstantPointer
                              ((Allocator *)module_local[6].loadStoreInfo.little[0xf].loadPointer,
                               (SynBase *)containerOrig->type,
                               *(int *)&(containerOrig->users).allocator,
                               ((VmConstant *)(reference->super_VmValue)._vptr_VmValue)->container,
                               (TypeBase *)variableRemap_local->storage[0].value,true);
      bVar1 = InplaceStr::empty((InplaceStr *)&containerOrig->name);
      if (!bVar1) {
        (argOrigInst->super_VmValue).comment.begin = (char *)containerOrig->name;
        (argOrigInst->super_VmValue).comment.end = *(char **)&containerOrig->nameHash;
      }
      ctx_local = (ExpressionContext *)argOrigInst;
    }
    else {
      this = (ExpressionContext *)VmModule::get<VmConstant>((VmModule *)argOrig_local);
      ptr = (VmConstant *)variableRemap_local->storage[0].key;
      local_60 = variableRemap_local->storage[0].value;
      VmConstant::VmConstant
                ((VmConstant *)this,
                 (Allocator *)module_local[6].loadStoreInfo.little[0xf].loadPointer,
                 *(VmType *)variableRemap_local->storage,(SynBase *)containerOrig->type);
      *(undefined4 *)((this->uniqueDependencies).little + 0xd) =
           *(undefined4 *)&(containerOrig->users).allocator;
      (this->uniqueDependencies).little[0x13] =
           (ModuleData *)(reference->super_VmValue)._vptr_VmValue[0x19];
      *(undefined1 *)((long)(this->uniqueDependencies).little + 0xa1) = 1;
      local_58 = this;
      SmallArray<VmConstant_*,_8U>::push_back
                ((SmallArray<VmConstant_*,_8U> *)((this->uniqueDependencies).little[0x13] + 1),
                 (VmConstant **)&local_58);
      bVar1 = InplaceStr::empty((InplaceStr *)&containerOrig->name);
      if (!bVar1) {
        ((InplaceStr *)&(local_58->uniqueDependencies).count)->begin = (char *)containerOrig->name;
        (local_58->uniqueDependencies).little[0] = *(ModuleData **)&containerOrig->nameHash;
      }
      ctx_local = local_58;
    }
  }
  return (VmValue *)ctx_local;
}

Assistant:

VmValue* RemapInstructionArgument(ExpressionContext &ctx, VmModule *module, VmValue *argOrig, const SmallDenseMap<VariableData*, VmConstant*, VariableDataHasher, 16> &variableRemap, const SmallDenseMap<VmInstruction*, VmInstruction*, VmInstructionHasher, 16> &instructionRemap)
{
	if(VmConstant *argOrigConstant = getType<VmConstant>(argOrig))
	{
		if(VariableData *containerOrig = argOrigConstant->container)
		{
			if(VmConstant **remap = variableRemap.find(containerOrig))
			{
				if(argOrigConstant->isReference)
				{
					VmConstant *reference = new (module->get<VmConstant>()) VmConstant(ctx.allocator, argOrig->type, argOrigConstant->source);

					reference->iValue = argOrigConstant->iValue;
					reference->container = (*remap)->container;
					reference->isReference = true;

					reference->container->users.push_back(reference);

					if(!argOrigConstant->comment.empty())
						reference->comment = argOrigConstant->comment;

					return reference;
				}

				VmConstant *ptr = CreateConstantPointer(ctx.allocator, argOrigConstant->source, argOrigConstant->iValue, (*remap)->container, argOrig->type.structType, true);

				if(!argOrigConstant->comment.empty())
					ptr->comment = argOrigConstant->comment;

				return ptr;
			}
		}

		return argOrigConstant;
	}
	else if(VmInstruction *argOrigInst = getType<VmInstruction>(argOrig))
	{
		VmInstruction **remap = instructionRemap.find(argOrigInst);

		assert(remap); // Has to be remapped

		return *remap;
	}
	else if(VmFunction *argOrigFunction = getType<VmFunction>(argOrig))
	{
		return argOrigFunction;
	}

	assert(!"unexpected type");

	return NULL;
}